

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
          (Serializer *this,
          vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
          *vec)

{
  pointer puVar1;
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> *item;
  pointer puVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (vec->
           super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (vec->
                super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    WriteValue<duckdb::ResultModifier>
              (this,(puVar2->
                    super_unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
                    .super__Head_base<0UL,_duckdb::ResultModifier_*,_false>._M_head_impl);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}